

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O0

void __thiscall
Diligent::GLContextState::BlitFramebufferNoScissor
          (GLContextState *this,GLint srcX0,GLint srcY0,GLint srcX1,GLint srcY1,GLint dstX0,
          GLint dstY0,GLint dstX1,GLint dstY1,GLbitfield mask,GLenum filter)

{
  bool bVar1;
  Char *Message;
  undefined1 local_60 [8];
  string msg;
  GLenum err;
  bool ScissorEnabled;
  GLint dstX0_local;
  GLint srcY1_local;
  GLint srcX1_local;
  GLint srcY0_local;
  GLint srcX0_local;
  GLContextState *this_local;
  
  bVar1 = EnableStateHelper::operator_cast_to_bool(&(this->m_RSState).ScissorTestEnable);
  if (bVar1) {
    EnableScissorTest(this,false);
  }
  (*__glewBlitFramebuffer)(srcX0,srcY0,srcX1,srcY1,dstX0,dstY0,dstX1,dstY1,mask,filter);
  msg.field_2._12_4_ = glGetError();
  if (msg.field_2._12_4_ != 0) {
    LogError<false,char[27],char[17],unsigned_int>
              (false,"BlitFramebufferNoScissor",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x3a9,(char (*) [27])"glBlitFramebuffer() failed",(char (*) [17])"\nGL Error Code: "
               ,(uint *)(msg.field_2._M_local_buf + 0xc));
    FormatString<char[6]>((string *)local_60,(char (*) [6])0x4585f6);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"BlitFramebufferNoScissor",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
               ,0x3a9);
    std::__cxx11::string::~string((string *)local_60);
  }
  if (bVar1) {
    EnableScissorTest(this,true);
  }
  return;
}

Assistant:

void GLContextState::BlitFramebufferNoScissor(GLint      srcX0,
                                              GLint      srcY0,
                                              GLint      srcX1,
                                              GLint      srcY1,
                                              GLint      dstX0,
                                              GLint      dstY0,
                                              GLint      dstX1,
                                              GLint      dstY1,
                                              GLbitfield mask,
                                              GLenum     filter)
{
    bool ScissorEnabled = m_RSState.ScissorTestEnable;
    if (ScissorEnabled)
        EnableScissorTest(false);

    glBlitFramebuffer(srcX0, srcY0, srcX1, srcY1, dstX0, dstY0, dstX1, dstY1, mask, filter);
    DEV_CHECK_GL_ERROR("glBlitFramebuffer() failed");

    if (ScissorEnabled)
        EnableScissorTest(true);
}